

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::base::CheckOpMessageBuilder::CheckOpMessageBuilder
          (CheckOpMessageBuilder *this,char *exprtext)

{
  ostringstream *this_00;
  ostream *poVar1;
  
  this_00 = (ostringstream *)operator_new(0x178);
  std::__cxx11::ostringstream::ostringstream(this_00);
  this->stream_ = (ostringstream *)this_00;
  poVar1 = std::operator<<((ostream *)this_00,exprtext);
  std::operator<<(poVar1," (");
  return;
}

Assistant:

CheckOpMessageBuilder::CheckOpMessageBuilder(const char *exprtext)
    : stream_(new ostringstream) {
  *stream_ << exprtext << " (";
}